

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

bool __thiscall EthBasePort::OptimizeFirewireGapCount(EthBasePort *this)

{
  undefined4 in_EAX;
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  uint uVar8;
  quadlet_t data;
  undefined8 uStack_38;
  
  uStack_38 = CONCAT44(1,in_EAX);
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[5])(this,0x3f,1,1,0);
  if ((char)iVar1 == '\0') goto LAB_00116809;
  uVar3 = 0;
  if ((this->super_BasePort).NumOfNodes_ == 0) {
    cVar7 = '?';
    cVar4 = '\0';
LAB_001166db:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"OptimizeFirewireGapCount: inconsistent gap counts (",0x33);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-",1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  }
  else {
    uVar8 = 0x3f;
    uVar5 = 0;
    do {
      iVar1 = (*(this->super_BasePort)._vptr_BasePort[4])
                        (this,uVar3 & 0xffff,2,(long)&uStack_38 + 4,0);
      if ((char)iVar1 == '\0') {
        return false;
      }
      uVar6 = (uint)((byte)(uStack_38 >> 0x20) & 0x3f);
      if ((uStack_38._4_4_ & 0x3f) < uVar8) {
        uVar8 = uVar6;
      }
      cVar7 = (char)uVar8;
      if (uVar5 < (uStack_38._4_4_ & 0x3f)) {
        uVar5 = uVar6;
      }
      cVar4 = (char)uVar5;
      uVar6 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar6;
    } while (uVar6 < (this->super_BasePort).NumOfNodes_);
    if (cVar7 != cVar4) goto LAB_001166db;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"OptimizeFirewireGapCount: current gap count is ",0x2f);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((cVar7 != '?') && (cVar7 == cVar4)) {
    return true;
  }
  uVar3 = (ulong)(this->super_BasePort).NumOfNodes_;
  uVar5 = 0x3f;
  if (uVar3 < 0x19) {
    uVar5 = (uint)"?\x05\a\b\n\r\x10\x12\x15\x18\x1a\x1d #%(+.0369;>?"[uVar3];
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"OptimizeFirewireGapCount: updating gap count to ",0x30);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uStack_38 = CONCAT44(uVar5,(undefined4)uStack_38) | 0x110000000000;
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[5])(this,0x3f,1,(ulong)(uVar5 | 0x1100),0);
  if ((char)iVar1 != '\0') {
    return true;
  }
LAB_00116809:
  poVar2 = (this->super_BasePort).outStr;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"OptimizeFirewireGapCount: failed to broadcast PHY command",0x39);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool EthBasePort::OptimizeFirewireGapCount()
{
    // Broadcast to all boards to initiate read of PHY register 1
    quadlet_t data = 1;
    if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::FW_PHY_REQ, data)) {
        outStr << "OptimizeFirewireGapCount: failed to broadcast PHY command" << std::endl;
        return false;
    }
    // Now, read each node to get the gap count
    unsigned char gap_count_min = gap_count_default;
    unsigned char gap_count_max = 0;
    for (unsigned int node = 0; node < NumOfNodes_; node++) {
        if (!ReadQuadletNode(node, BoardIO::FW_PHY_RESP, data))
            return false;
        unsigned char gap_count = static_cast<unsigned char>(data) & 0x3f;
        if (gap_count < gap_count_min)
            gap_count_min = gap_count;
        if (gap_count > gap_count_max)
            gap_count_max = gap_count;
    }
    if (gap_count_min == gap_count_max) {
        std::cout << "OptimizeFirewireGapCount: current gap count is "
                  << static_cast<unsigned int>(gap_count_min) << std::endl;
    }
    else if (gap_count_min != gap_count_max)
        std::cout << "OptimizeFirewireGapCount: inconsistent gap counts ("
                  << static_cast<unsigned int>(gap_count_min) << "-"
                  << static_cast<unsigned int>(gap_count_max) << ")" << std::endl;
    // Update the gap count if it is inconsistent, or if the gap count is the default value of 63,
    // which would indicate that it has not yet been set (e.g., there is PC connected via Firewire).
    if ((gap_count_min != gap_count_max) || (gap_count_min == gap_count_default)) {
        unsigned char gap_count_new = gap_count_default;
        if (NumOfNodes_ < 25)
            gap_count_new = gap_counts[NumOfNodes_];
        std::cout << "OptimizeFirewireGapCount: updating gap count to "
                  << static_cast<unsigned int>(gap_count_new) << std::endl;
        // Set bit 12 to indicate write; addr (1) in bits 11-8, data (gap_count) in bits 7-0
        data = 0x00001100 | static_cast<quadlet_t>(gap_count_new);
        if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::FW_PHY_REQ, data)) {
            outStr << "OptimizeFirewireGapCount: failed to broadcast PHY command" << std::endl;
            return false;
        }
    }
    return true;
}